

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

int __thiscall
IDisk::AddMFMByteToSpecificTrack
          (IDisk *this,int side,int track,int rev,uint index,uchar byte,int datasize)

{
  int local_28;
  int d;
  uchar byte_local;
  uint index_local;
  int rev_local;
  int track_local;
  int side_local;
  IDisk *this_local;
  
  d = index;
  for (local_28 = 0; local_28 < datasize; local_28 = local_28 + 1) {
    if (this->side_[side].tracks[track].revolution[rev].size <= (uint)d) {
      d = 0;
    }
    this->side_[side].tracks[track].revolution[rev].bitfield[(uint)d] =
         (byte)((int)(uint)byte >> (((char)datasize + -1) - (char)local_28 & 0x1fU)) & 1;
    d = d + 1;
  }
  return d;
}

Assistant:

int IDisk::AddMFMByteToSpecificTrack(int side, int track, int rev, unsigned int index, unsigned char byte, int datasize)
{
   for (int d = 0; d < datasize; d++)
   {
      if (index >= side_[side].tracks[track].revolution[rev].size)
      {
         index = 0;
      }
      side_[side].tracks[track].revolution[rev].bitfield[index++] = ((byte >> (datasize - 1 - d)) & 0x01);
   }
   return index;
}